

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O3

int Dch_NodesAreEqual(void *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = *(uint *)((long)p + 4);
  if (1 < (int)uVar4) {
    uVar1 = pObj0->Id;
    if ((-1 < (long)(int)uVar1) && (uVar1 < uVar4)) {
      uVar2 = pObj1->Id;
      if ((-1 < (long)(int)uVar2) && (uVar2 < uVar4)) {
        plVar3 = *(long **)((long)p + 8);
        uVar4 = (uint)((ulong)(plVar3[1] - *plVar3) >> 2);
        if (((*(uint *)&pObj1->field_0x18 ^ *(uint *)&pObj0->field_0x18) & 8) == 0) {
          if ((int)uVar4 < 1) {
            return 1;
          }
          uVar5 = 0;
          while (*(int *)(plVar3[(int)uVar1] + uVar5 * 4) ==
                 *(int *)(plVar3[(int)uVar2] + uVar5 * 4)) {
            uVar5 = uVar5 + 1;
            if ((uVar4 & 0x7fffffff) == uVar5) {
              return 1;
            }
          }
        }
        else {
          if ((int)uVar4 < 1) {
            return 1;
          }
          uVar5 = 0;
          while ((*(uint *)(plVar3[(int)uVar2] + uVar5 * 4) ^
                 *(uint *)(plVar3[(int)uVar1] + uVar5 * 4)) == 0xffffffff) {
            uVar5 = uVar5 + 1;
            if ((uVar4 & 0x7fffffff) == uVar5) {
              return 1;
            }
          }
        }
        return 0;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Dch_NodesAreEqual( void * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim0, * pSim1;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim0 = Dch_ObjSim( vSims, pObj0 );
    pSim1 = Dch_ObjSim( vSims, pObj1 );
    if ( pObj0->fPhase != pObj1->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != ~pSim1[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != pSim1[k] )
                return 0;
    }
    return 1;
}